

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::VolumeMeshVertexScalarQuantity
          (VolumeMeshVertexScalarQuantity *this,string *name,
          vector<float,_std::allocator<float>_> *values_,VolumeMesh *mesh_,DataType dataType_)

{
  pointer pcVar1;
  string local_70;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"vertex","");
  VolumeMeshScalarQuantity::VolumeMeshScalarQuantity
            (&this->super_VolumeMeshScalarQuantity,&local_50,mesh_,&local_70,values_,dataType_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
  super_QuantityS<polyscope::VolumeMesh>.super_Quantity._vptr_Quantity =
       (_func_int **)&PTR__VolumeMeshVertexScalarQuantity_005f9c68;
  (this->super_VolumeMeshScalarQuantity).super_ScalarQuantity<polyscope::VolumeMeshScalarQuantity>.
  _vptr_ScalarQuantity = (_func_int **)&DAT_005f9d08;
  (this->levelSetProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->levelSetProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->levelSetProgram).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 5) = 0;
  this->showQuantity = this;
  VolumeMesh::refreshVolumeMeshListeners
            ((this->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
             super_QuantityS<polyscope::VolumeMesh>.parent);
  return;
}

Assistant:

VolumeMeshVertexScalarQuantity::VolumeMeshVertexScalarQuantity(std::string name, const std::vector<float>& values_,
                                                               VolumeMesh& mesh_, DataType dataType_)
    : VolumeMeshScalarQuantity(name, mesh_, "vertex", values_, dataType_), levelSetValue(0), isDrawingLevelSet(false),
      showQuantity(this)

{
  parent.refreshVolumeMeshListeners(); // just in case this quantity is being drawn
}